

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
reset(basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this)

{
  uint uVar1;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RDI;
  basic_staj_visitor<char> *in_stack_00000030;
  
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::reset(in_RDI);
  basic_staj_visitor<char>::reset(in_stack_00000030);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)in_RDI);
  in_RDI[1].source_.null_is_.super_basic_istream<char,_std::char_traits<char>_>.field_0x108 = 0;
  uVar1 = (*(in_RDI->super_ser_context)._vptr_ser_context[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_ser_context)._vptr_ser_context[7])();
  }
  return;
}

Assistant:

void reset()
    {
        parser_.reset();
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }